

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O2

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint64_t *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t uVar13;
  
  iVar5 = run_container_cardinality(container1);
  iVar6 = container2->cardinality;
  if (iVar6 == -1) {
    iVar6 = bitset_container_compute_cardinality(container2);
  }
  uVar7 = 0;
  if (iVar6 == iVar5) {
    uVar3 = container1->n_runs;
    uVar9 = 0;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
      uVar1 = container1->runs[uVar7].value;
      uVar2 = container1->runs[uVar7].length;
      if (uVar2 == 0) {
        if ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_0011936a;
      }
      else {
        uVar8 = (uint)uVar2 + (uint)uVar1 + 1;
        uVar10 = (ulong)(uVar1 >> 6);
        uVar11 = -1L << ((byte)uVar1 & 0x3f);
        uVar12 = -1L << ((byte)uVar8 & 0x3f);
        uVar8 = uVar8 >> 6;
        puVar4 = container2->words;
        if (uVar1 >> 6 == uVar8) {
          if ((uVar11 & ~(puVar4[uVar10] | uVar12)) != 0) {
LAB_0011936a:
            uVar7 = 0;
            goto LAB_0011936c;
          }
        }
        else {
          if (puVar4[uVar10] < uVar11) goto LAB_0011936a;
          if ((uint)uVar2 + (uint)uVar1 < 0xffff) {
            uVar13 = uVar12 | puVar4[uVar8];
            goto joined_r0x0011934b;
          }
          while ((uVar10 < 0x3ff && (uVar10 + 1 < (ulong)uVar8))) {
            uVar13 = puVar4[uVar10 + 1];
            uVar10 = uVar10 + 1;
joined_r0x0011934b:
            if (uVar13 != 0xffffffffffffffff) goto LAB_0011936a;
          }
        }
      }
    }
    uVar7 = (ulong)((long)(int)uVar3 <= (long)uVar7);
  }
LAB_0011936c:
  return SUB81(uVar7,0);
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {
    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)
                          ? container2->cardinality
                          : bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}